

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::CumulativeReporterBase::sectionStarting
          (CumulativeReporterBase *this,SectionInfo *sectionInfo)

{
  bool bVar1;
  reference ppSVar2;
  pointer this_00;
  unique_ptr<Catch::CumulativeReporterBase::SectionNode> local_120;
  unique_ptr<Catch::CumulativeReporterBase::SectionNode> newNode;
  BySectionInfo local_110;
  __normal_iterator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_*,_std::vector<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>_>
  local_108;
  __normal_iterator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_*,_std::vector<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>_>
  local_100;
  __normal_iterator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_*,_std::vector<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>_>
  local_f8;
  __normal_iterator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_*,_std::vector<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>_>
  it;
  SectionNode *parentNode;
  SectionNode *local_e0;
  SectionNode *node;
  Counts local_c8;
  SectionInfo local_a8;
  undefined1 local_78 [8];
  SectionStats incompleteStats;
  SectionInfo *sectionInfo_local;
  CumulativeReporterBase *this_local;
  
  incompleteStats._88_8_ = sectionInfo;
  SectionInfo::SectionInfo(&local_a8,sectionInfo);
  local_c8.failedButOk = 0;
  local_c8.skipped = 0;
  local_c8.passed = 0;
  local_c8.failed = 0;
  Counts::Counts(&local_c8);
  SectionStats::SectionStats((SectionStats *)local_78,&local_a8,&local_c8,0.0,false);
  SectionInfo::~SectionInfo(&local_a8);
  bVar1 = std::
          vector<Catch::CumulativeReporterBase::SectionNode_*,_std::allocator<Catch::CumulativeReporterBase::SectionNode_*>_>
          ::empty(&this->m_sectionStack);
  if (bVar1) {
    bVar1 = Detail::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->m_rootSection);
    if (!bVar1) {
      Detail::make_unique<Catch::CumulativeReporterBase::SectionNode,Catch::SectionStats&>
                ((Detail *)&parentNode,(SectionStats *)local_78);
      Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>::operator=
                (&this->m_rootSection,
                 (unique_ptr<Catch::CumulativeReporterBase::SectionNode> *)&parentNode);
      Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>::~unique_ptr
                ((unique_ptr<Catch::CumulativeReporterBase::SectionNode> *)&parentNode);
    }
    local_e0 = Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>::get
                         (&this->m_rootSection);
  }
  else {
    ppSVar2 = std::
              vector<Catch::CumulativeReporterBase::SectionNode_*,_std::allocator<Catch::CumulativeReporterBase::SectionNode_*>_>
              ::back(&this->m_sectionStack);
    it._M_current = (unique_ptr<Catch::CumulativeReporterBase::SectionNode> *)*ppSVar2;
    local_100._M_current =
         (unique_ptr<Catch::CumulativeReporterBase::SectionNode> *)
         std::
         vector<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
         ::begin(&((value_type)it._M_current)->childSections);
    local_108._M_current =
         (unique_ptr<Catch::CumulativeReporterBase::SectionNode> *)
         std::
         vector<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
         ::end((vector<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
                *)(it._M_current + 0xc));
    anon_unknown_26::BySectionInfo::BySectionInfo(&local_110,(SectionInfo *)incompleteStats._88_8_);
    local_f8 = std::
               find_if<__gnu_cxx::__normal_iterator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>*,std::vector<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>,std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>>>>,Catch::(anonymous_namespace)::BySectionInfo>
                         (local_100,local_108,&local_110);
    newNode.m_ptr =
         (SectionNode *)
         std::
         vector<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
         ::end((vector<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
                *)(it._M_current + 0xc));
    bVar1 = __gnu_cxx::operator==
                      (&local_f8,
                       (__normal_iterator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_*,_std::vector<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>_>
                        *)&newNode);
    if (bVar1) {
      Detail::make_unique<Catch::CumulativeReporterBase::SectionNode,Catch::SectionStats&>
                ((Detail *)&local_120,(SectionStats *)local_78);
      local_e0 = Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>::get(&local_120);
      std::
      vector<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
      ::push_back((vector<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
                   *)(it._M_current + 0xc),&local_120);
      Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>::~unique_ptr(&local_120);
    }
    else {
      this_00 = __gnu_cxx::
                __normal_iterator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_*,_std::vector<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>_>
                ::operator->(&local_f8);
      local_e0 = Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>::get(this_00);
    }
  }
  this->m_deepestSection = local_e0;
  std::
  vector<Catch::CumulativeReporterBase::SectionNode_*,_std::allocator<Catch::CumulativeReporterBase::SectionNode_*>_>
  ::push_back(&this->m_sectionStack,&local_e0);
  SectionStats::~SectionStats((SectionStats *)local_78);
  return;
}

Assistant:

void
    CumulativeReporterBase::sectionStarting( SectionInfo const& sectionInfo ) {
        // We need a copy, because SectionStats expect to take ownership
        SectionStats incompleteStats( SectionInfo(sectionInfo), Counts(), 0, false );
        SectionNode* node;
        if ( m_sectionStack.empty() ) {
            if ( !m_rootSection ) {
                m_rootSection =
                    Detail::make_unique<SectionNode>( incompleteStats );
            }
            node = m_rootSection.get();
        } else {
            SectionNode& parentNode = *m_sectionStack.back();
            auto it = std::find_if( parentNode.childSections.begin(),
                                    parentNode.childSections.end(),
                                    BySectionInfo( sectionInfo ) );
            if ( it == parentNode.childSections.end() ) {
                auto newNode =
                    Detail::make_unique<SectionNode>( incompleteStats );
                node = newNode.get();
                parentNode.childSections.push_back( CATCH_MOVE( newNode ) );
            } else {
                node = it->get();
            }
        }

        m_deepestSection = node;
        m_sectionStack.push_back( node );
    }